

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void math1Func(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  code *rVal;
  sqlite3_context *in_RDI;
  double dVar2;
  sqlite3_context *pCtx;
  _func_double_double *x;
  double ans;
  double v0;
  int type0;
  
  iVar1 = sqlite3_value_numeric_type((sqlite3_value *)0xffffffffffffffff);
  if ((iVar1 == 1) || (iVar1 == 2)) {
    dVar2 = sqlite3_value_double((sqlite3_value *)0x2265d6);
    rVal = (code *)sqlite3_user_data(in_RDI);
    pCtx = (sqlite3_context *)(*rVal)(dVar2);
    sqlite3_result_double(pCtx,(double)rVal);
  }
  return;
}

Assistant:

static void math1Func(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  int type0;
  double v0, ans;
  double (*x)(double);
  assert( argc==1 );
  type0 = sqlite3_value_numeric_type(argv[0]);
  if( type0!=SQLITE_INTEGER && type0!=SQLITE_FLOAT ) return;
  v0 = sqlite3_value_double(argv[0]);
  x = (double(*)(double))sqlite3_user_data(context);
  ans = x(v0);
  sqlite3_result_double(context, ans);
}